

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

Own<kj::_::ImmediatePromiseNode<unsigned_long>_> __thiscall
kj::heap<kj::_::ImmediatePromiseNode<unsigned_long>,unsigned_long>(kj *this,unsigned_long *params)

{
  ImmediatePromiseNode<unsigned_long> *pIVar1;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX_00;
  Own<kj::_::ImmediatePromiseNode<unsigned_long>_> OVar2;
  ExceptionOr<unsigned_long> local_188;
  
  pIVar1 = (ImmediatePromiseNode<unsigned_long> *)operator_new(0x178);
  local_188.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_188.value.ptr.isSet = true;
  local_188.value.ptr.field_1.value = *params;
  _::ImmediatePromiseNode<unsigned_long>::ImmediatePromiseNode(pIVar1,&local_188);
  *(undefined8 **)this = &_::HeapDisposer<kj::_::ImmediatePromiseNode<unsigned_long>>::instance;
  *(ImmediatePromiseNode<unsigned_long> **)(this + 8) = pIVar1;
  pIVar1 = extraout_RDX;
  if (local_188.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_188.super_ExceptionOrValue.exception.ptr.field_1.value);
    pIVar1 = extraout_RDX_00;
  }
  OVar2.ptr = pIVar1;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}